

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseMessageTest_NestedEnum_Test::TestBody
          (ParseMessageTest_NestedEnum_Test *this)

{
  ParserTest::ExpectParsesTo
            (&this->super_ParseMessageTest,
             "message TestMessage {\n  enum NestedEnum {}\n  optional NestedEnum test_enum = 1;\n}\n"
             ,
             "message_type {  name: \"TestMessage\"  enum_type {    name: \"NestedEnum\"  }  field { name:\"test_enum\" label:LABEL_OPTIONAL number:1          type_name: \"NestedEnum\" }}"
            );
  return;
}

Assistant:

TEST_F(ParseMessageTest, NestedEnum) {
  ExpectParsesTo(
      "message TestMessage {\n"
      "  enum NestedEnum {}\n"
      "  optional NestedEnum test_enum = 1;\n"
      "}\n",

      "message_type {"
      "  name: \"TestMessage\""
      "  enum_type {"
      "    name: \"NestedEnum\""
      "  }"
      "  field { name:\"test_enum\" label:LABEL_OPTIONAL number:1"
      "          type_name: \"NestedEnum\" }"
      "}");
}